

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O1

Matrix __thiscall Matrix::GenerateMatrix(Matrix *this,int n,int param)

{
  double *pdVar1;
  undefined8 extraout_RDX;
  int j;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Matrix MVar8;
  random_device device;
  random_device local_13b8;
  
  this->data = (double *)0x0;
  this->rows = n;
  this->cols = n;
  pdVar1 = (double *)operator_new__((ulong)(uint)(n * n) << 3);
  this->data = pdVar1;
  std::random_device::random_device(&local_13b8);
  dVar5 = exp2((double)param * 0.25);
  dVar6 = exp2((double)param * 0.25);
  if (0 < n) {
    uVar4 = (ulong)(uint)n;
    uVar3 = 0;
    do {
      uVar2 = 0;
      do {
        dVar7 = std::generate_canonical<double,53ul,std::random_device>(&local_13b8);
        pdVar1[uVar2] = dVar7 * (dVar6 + dVar5) + -dVar5;
        uVar2 = uVar2 + 1;
      } while (uVar4 != uVar2);
      uVar3 = uVar3 + 1;
      pdVar1 = pdVar1 + uVar4;
    } while (uVar3 != uVar4);
  }
  std::random_device::_M_fini();
  MVar8.rows = (int)extraout_RDX;
  MVar8.cols = (int)((ulong)extraout_RDX >> 0x20);
  MVar8.data = (double *)this;
  return MVar8;
}

Assistant:

Matrix Matrix::GenerateMatrix(int n, int param)
{
    Matrix m(n, n);

    std::random_device device;
    std::uniform_real_distribution<double> distr(
        -pow(2, static_cast<double>(param) / 4),
        pow(2, static_cast<double>(param) / 4)
    );

    for (int i = 0; i < n; ++i)
    {
        for (int j = 0; j < n; j++)
        {
            const auto generated = distr(device);
            m(i, j) = generated;
        }
    }

    return m;
}